

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

void chaiscript::dispatch::detail::
     call_func<chaiscript::dispatch::detail::Caller<void,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,chaiscript::Boxed_Value_const&>,void,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,chaiscript::Boxed_Value_const&,0ul,1ul>
               (undefined8 param_1,undefined8 param_2,
               vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *param_3,
               undefined8 param_4)

{
  Type_Conversions_State *in_stack_000000a0;
  Boxed_Value *in_stack_000000a8;
  Type_Conversions_State *in_stack_000000b0;
  Boxed_Value *in_stack_000000b8;
  Boxed_Value *inner;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_ffffffffffffffb8;
  Caller<void,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_const_chaiscript::Boxed_Value_&>
  *in_stack_ffffffffffffffc0;
  Boxed_Value local_38;
  undefined8 local_28;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_3,0);
  boxed_cast<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&>
            (in_stack_000000b8,in_stack_000000b0);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (local_20,1);
  inner = &local_38;
  boxed_cast<chaiscript::Boxed_Value_const&>(in_stack_000000a8,in_stack_000000a0);
  Caller<void,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,chaiscript::Boxed_Value_const&>
  ::operator()(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,inner);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x3de108);
  return;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }